

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O3

int __thiscall
Signal<std::shared_ptr<Reaction>_>::Connect
          (Signal<std::shared_ptr<Reaction>_> *this,function<void_(std::shared_ptr<Reaction>)> *slot
          )

{
  function<void_(std::shared_ptr<Reaction>)> *this_00;
  pair<int,_std::function<void_(std::shared_ptr<Reaction>)>_> local_38;
  
  local_38.first = this->current_id_ + 1;
  this->current_id_ = local_38.first;
  this_00 = &local_38.second;
  std::function<void_(std::shared_ptr<Reaction>)>::function(this_00,slot);
  std::
  _Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>>
  ::_M_emplace_unique<std::pair<int,std::function<void(std::shared_ptr<Reaction>)>>>
            ((_Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>>
              *)this,&local_38);
  if (local_38.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.second.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return this->current_id_;
}

Assistant:

int Connect(std::function<void(Args...)> const &slot) const {
    slots_.insert(std::make_pair(++current_id_, slot));
    return current_id_;
  }